

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O2

void __thiscall
btDbvtBroadphase::setAabb
          (btDbvtBroadphase *this,btBroadphaseProxy *absproxy,btVector3 *aabbMin,btVector3 *aabbMax,
          btDispatcher *param_4)

{
  int iVar1;
  btDbvtProxy *pbVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  bool bVar5;
  btDbvtNode *pbVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar7;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar8;
  float fVar9;
  btVector3 bVar10;
  btVector3 velocity;
  btDbvtVolume aabb;
  undefined1 local_a8 [28];
  btScalar local_8c;
  btDbvtVolume local_88;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  btVector3 local_40;
  
  local_88.mi.m_floats._0_8_ = *(undefined8 *)aabbMin->m_floats;
  local_88.mi.m_floats._8_8_ = *(undefined8 *)(aabbMin->m_floats + 2);
  local_88.mx.m_floats._0_8_ = *(undefined8 *)aabbMax->m_floats;
  local_88.mx.m_floats._8_8_ = *(undefined8 *)(aabbMax->m_floats + 2);
  if (absproxy[1].m_uniqueId == 2) {
    btDbvt::remove((btDbvt *)&this->field_0x68,(char *)absproxy[1].m_clientObject);
    pbVar6 = btDbvt::insert((btDbvt *)&this->field_0x8,&local_88,absproxy);
    absproxy[1].m_clientObject = pbVar6;
  }
  else {
    this->m_updates_call = this->m_updates_call + 1;
    bVar5 = Intersect((btDbvtAabbMm *)absproxy[1].m_clientObject,&local_88);
    if (bVar5) {
      bVar10 = operator-(aabbMin,&absproxy->m_aabbMin);
      local_68._8_4_ = extraout_XMM0_Dc;
      local_68._0_8_ = bVar10.m_floats._0_8_;
      local_68._12_4_ = extraout_XMM0_Dd;
      local_58._8_4_ = in_XMM1_Dc;
      local_58._0_8_ = bVar10.m_floats._8_8_;
      local_58._12_4_ = in_XMM1_Dd;
      local_40 = operator-(&absproxy->m_aabbMax,&absproxy->m_aabbMin);
      local_8c = 2.0;
      bVar10 = operator/(&local_40,&local_8c);
      fVar9 = this->m_prediction;
      fVar7 = bVar10.m_floats[2] * fVar9;
      fVar8 = fVar9 * bVar10.m_floats[0];
      fVar9 = fVar9 * bVar10.m_floats[1];
      local_a8._4_4_ = fVar9;
      local_a8._0_4_ = fVar8;
      local_a8._8_4_ = fVar7;
      if ((float)local_68._0_4_ < 0.0) {
        local_a8._4_8_ = local_a8._4_8_;
        local_a8._0_4_ = -fVar8;
      }
      if ((float)local_68._4_4_ < 0.0) {
        uVar4 = local_a8._8_4_;
        local_a8._0_8_ = CONCAT44(fVar9,local_a8._0_4_) ^ 0x8000000000000000;
        local_a8._8_4_ = uVar4;
      }
      if ((float)local_58._0_4_ < 0.0) {
        local_a8._8_4_ = -fVar7;
      }
      local_a8._12_4_ = 0;
      bVar5 = btDbvt::update((btDbvt *)&this->field_0x8,(btDbvtNode *)absproxy[1].m_clientObject,
                             &local_88,(btVector3 *)local_a8,0.05);
      if (bVar5) {
        this->m_updates_done = this->m_updates_done + 1;
      }
      goto LAB_00130374;
    }
    btDbvt::update((btDbvt *)&this->field_0x8,(btDbvtNode *)absproxy[1].m_clientObject,&local_88);
    this->m_updates_done = this->m_updates_done + 1;
  }
  bVar5 = true;
LAB_00130374:
  listremove<btDbvtProxy>((btDbvtProxy *)absproxy,this->m_stageRoots + absproxy[1].m_uniqueId);
  uVar3 = *(undefined8 *)(aabbMin->m_floats + 2);
  *(undefined8 *)(absproxy->m_aabbMin).m_floats = *(undefined8 *)aabbMin->m_floats;
  *(undefined8 *)((absproxy->m_aabbMin).m_floats + 2) = uVar3;
  uVar3 = *(undefined8 *)(aabbMax->m_floats + 2);
  *(undefined8 *)(absproxy->m_aabbMax).m_floats = *(undefined8 *)aabbMax->m_floats;
  *(undefined8 *)((absproxy->m_aabbMax).m_floats + 2) = uVar3;
  iVar1 = this->m_stageCurrent;
  absproxy[1].m_uniqueId = iVar1;
  absproxy[1].m_collisionFilterGroup = 0;
  absproxy[1].m_collisionFilterMask = 0;
  *(undefined4 *)&absproxy[1].field_0xc = 0;
  pbVar2 = this->m_stageRoots[iVar1];
  absproxy[1].m_multiSapParentProxy = pbVar2;
  if (pbVar2 != (btDbvtProxy *)0x0) {
    pbVar2->links[0] = (btDbvtProxy *)absproxy;
  }
  this->m_stageRoots[iVar1] = (btDbvtProxy *)absproxy;
  if ((bVar5 != false) && (this->m_needcleanup = true, this->m_deferedcollide == false)) {
    local_a8._8_8_ = this;
    local_a8._0_8_ = &PTR__ICollide_001ec108;
    btDbvt::collideTTpersistentStack
              ((btDbvt *)&this->field_0x68,*(btDbvtNode **)&this->field_0x68,
               (btDbvtNode *)absproxy[1].m_clientObject,(ICollide *)local_a8);
    btDbvt::collideTTpersistentStack
              ((btDbvt *)&this->field_0x8,*(btDbvtNode **)&this->field_0x8,
               (btDbvtNode *)absproxy[1].m_clientObject,(ICollide *)local_a8);
  }
  return;
}

Assistant:

void							btDbvtBroadphase::setAabb(		btBroadphaseProxy* absproxy,
														  const btVector3& aabbMin,
														  const btVector3& aabbMax,
														  btDispatcher* /*dispatcher*/)
{
	btDbvtProxy*						proxy=(btDbvtProxy*)absproxy;
	ATTRIBUTE_ALIGNED16(btDbvtVolume)	aabb=btDbvtVolume::FromMM(aabbMin,aabbMax);
#if DBVT_BP_PREVENTFALSEUPDATE
	if(NotEqual(aabb,proxy->leaf->volume))
#endif
	{
		bool	docollide=false;
		if(proxy->stage==STAGECOUNT)
		{/* fixed -> dynamic set	*/ 
			m_sets[1].remove(proxy->leaf);
			proxy->leaf=m_sets[0].insert(aabb,proxy);
			docollide=true;
		}
		else
		{/* dynamic set				*/ 
			++m_updates_call;
			if(Intersect(proxy->leaf->volume,aabb))
			{/* Moving				*/ 

				const btVector3	delta=aabbMin-proxy->m_aabbMin;
				btVector3		velocity(((proxy->m_aabbMax-proxy->m_aabbMin)/2)*m_prediction);
				if(delta[0]<0) velocity[0]=-velocity[0];
				if(delta[1]<0) velocity[1]=-velocity[1];
				if(delta[2]<0) velocity[2]=-velocity[2];
				if	(
#ifdef DBVT_BP_MARGIN				
					m_sets[0].update(proxy->leaf,aabb,velocity,DBVT_BP_MARGIN)
#else
					m_sets[0].update(proxy->leaf,aabb,velocity)
#endif
					)
				{
					++m_updates_done;
					docollide=true;
				}
			}
			else
			{/* Teleporting			*/ 
				m_sets[0].update(proxy->leaf,aabb);
				++m_updates_done;
				docollide=true;
			}	
		}
		listremove(proxy,m_stageRoots[proxy->stage]);
		proxy->m_aabbMin = aabbMin;
		proxy->m_aabbMax = aabbMax;
		proxy->stage	=	m_stageCurrent;
		listappend(proxy,m_stageRoots[m_stageCurrent]);
		if(docollide)
		{
			m_needcleanup=true;
			if(!m_deferedcollide)
			{
				btDbvtTreeCollider	collider(this);
				m_sets[1].collideTTpersistentStack(m_sets[1].m_root,proxy->leaf,collider);
				m_sets[0].collideTTpersistentStack(m_sets[0].m_root,proxy->leaf,collider);
			}
		}	
	}
}